

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

void __thiscall
google::protobuf::anon_unknown_19::FieldValuePrinterWrapper::PrintFieldName
          (FieldValuePrinterWrapper *this,Message *message,int field_index,int field_count,
          Reflection *reflection,FieldDescriptor *field,BaseTextGenerator *generator)

{
  FieldValuePrinter *pFVar1;
  undefined8 local_30;
  undefined8 local_28;
  
  pFVar1 = (this->delegate_)._M_t.
           super___uniq_ptr_impl<const_google::protobuf::TextFormat::FieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FieldValuePrinter>_>
           ._M_t.
           super__Tuple_impl<0UL,_const_google::protobuf::TextFormat::FieldValuePrinter_*,_std::default_delete<const_google::protobuf::TextFormat::FieldValuePrinter>_>
           .super__Head_base<0UL,_const_google::protobuf::TextFormat::FieldValuePrinter_*,_false>.
           _M_head_impl;
  (*pFVar1->_vptr_FieldValuePrinter[0xc])(&local_30,pFVar1,message,reflection,field);
  (*generator->_vptr_BaseTextGenerator[5])(generator,local_30,local_28);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void PrintFieldName(const Message& message, int field_index, int field_count,
                      const Reflection* reflection,
                      const FieldDescriptor* field,
                      TextFormat::BaseTextGenerator* generator) const override {
    generator->PrintString(
        delegate_->PrintFieldName(message, reflection, field));
  }